

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2f::BuildLogTestMultiTargetEdge::Run(BuildLogTestMultiTargetEdge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  LogEntry *pLVar5;
  LogEntry *pLVar6;
  BuildLog log;
  string local_a8;
  BuildLog local_88;
  
  AssertParse(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_,
              "build out out.d: cat\n",(ManifestParserOptions)0x0);
  BuildLog::BuildLog(&local_88);
  BuildLog::RecordCommand
            (&local_88,
             *(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.edges_.
              super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
              _M_start,0x15,0x16,0);
  bVar3 = testing::Test::Check
                    (g_current_test,local_88.entries_._M_h._M_element_count == 2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0x131,"2u == log.entries().size()");
  if (bVar3) {
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"out","");
    pLVar5 = BuildLog::LookupByOutput(&local_88,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = testing::Test::Check
                      (g_current_test,pLVar5 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0x133,"e1");
    if (bVar3) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"out.d","");
      pLVar6 = BuildLog::LookupByOutput(&local_88,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = testing::Test::Check
                        (g_current_test,pLVar6 != (LogEntry *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                         ,0x135,"e2");
      pTVar2 = g_current_test;
      if (bVar3) {
        iVar4 = std::__cxx11::string::compare((char *)pLVar5);
        bVar3 = testing::Test::Check
                          (pTVar2,iVar4 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0x136,"\"out\" == e1->output");
        pTVar2 = g_current_test;
        if (bVar3) {
          iVar4 = std::__cxx11::string::compare((char *)pLVar6);
          bVar3 = testing::Test::Check
                            (pTVar2,iVar4 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                             ,0x137,"\"out.d\" == e2->output");
          if ((((bVar3) &&
               (bVar3 = testing::Test::Check
                                  (g_current_test,pLVar5->start_time == 0x15,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                   ,0x138,"21 == e1->start_time"), bVar3)) &&
              (bVar3 = testing::Test::Check
                                 (g_current_test,pLVar6->start_time == 0x15,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x139,"21 == e2->start_time"), bVar3)) &&
             ((bVar3 = testing::Test::Check
                                 (g_current_test,pLVar6->end_time == 0x16,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x13a,"22 == e2->end_time"), bVar3 &&
              (bVar3 = testing::Test::Check
                                 (g_current_test,pLVar6->end_time == 0x16,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x13b,"22 == e2->end_time"), bVar3)))) goto LAB_0011fb1e;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0011fb1e:
  BuildLog::~BuildLog(&local_88);
  return;
}

Assistant:

TEST_F(BuildLogTest, MultiTargetEdge) {
  AssertParse(&state_,
"build out out.d: cat\n");

  BuildLog log;
  log.RecordCommand(state_.edges_[0], 21, 22);

  ASSERT_EQ(2u, log.entries().size());
  BuildLog::LogEntry* e1 = log.LookupByOutput("out");
  ASSERT_TRUE(e1);
  BuildLog::LogEntry* e2 = log.LookupByOutput("out.d");
  ASSERT_TRUE(e2);
  ASSERT_EQ("out", e1->output);
  ASSERT_EQ("out.d", e2->output);
  ASSERT_EQ(21, e1->start_time);
  ASSERT_EQ(21, e2->start_time);
  ASSERT_EQ(22, e2->end_time);
  ASSERT_EQ(22, e2->end_time);
}